

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall CoinsViews::InitCache(CoinsViews *this)

{
  CCoinsViewCache *pCVar1;
  _Head_base<0UL,_CCoinsViewCache_*,_false> _Var2;
  long in_FS_OFFSET;
  _Head_base<0UL,_CCoinsViewCache_*,_false> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<CCoinsViewCache,CCoinsViewErrorCatcher*>((CCoinsViewErrorCatcher **)&local_20);
  _Var2._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (CCoinsViewCache *)0x0;
  pCVar1 = (this->m_cacheview)._M_t.
           super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_>._M_t.
           super__Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_>.
           super__Head_base<0UL,_CCoinsViewCache_*,_false>._M_head_impl;
  (this->m_cacheview)._M_t.
  super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_>._M_t.
  super__Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_>.
  super__Head_base<0UL,_CCoinsViewCache_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (pCVar1 != (CCoinsViewCache *)0x0) {
    (**(code **)(*(long *)&(pCVar1->super_CCoinsViewBacked).super_CCoinsView + 0x38))();
    if (local_20._M_head_impl != (CCoinsViewCache *)0x0) {
      (*((local_20._M_head_impl)->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[7])();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CoinsViews::InitCache()
{
    AssertLockHeld(::cs_main);
    m_cacheview = std::make_unique<CCoinsViewCache>(&m_catcherview);
}